

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
smf::MidiMessage::intToVlv
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,int value)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  uchar byte5;
  uchar byte1;
  byte local_1e;
  byte local_1d;
  byte local_1c;
  byte local_1b;
  byte local_1a;
  byte local_19;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_19 = (byte)value;
  if (value < 0x80) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_19);
    return __return_storage_ptr__;
  }
  local_1a = local_19 & 0x7f;
  bVar1 = (byte)((uint)value >> 7);
  local_1e = bVar1 & 0x7f;
  bVar3 = (byte)((uint)value >> 0xe);
  local_1c = bVar3 & 0x7f;
  bVar4 = (byte)((uint)value >> 0x15);
  local_1d = bVar4 & 0x7f;
  local_1b = (byte)((uint)value >> 0x1c);
  if ((uint)value < 0x10000000) {
    if (((uint)value >> 0x15 & 0x7f) != 0) goto LAB_00123200;
    bVar2 = true;
    if (((uint)value >> 0xe & 0x7f) != 0) goto LAB_00123210;
    if (((uint)value >> 7 & 0x7f) == 0) goto LAB_0012325e;
    local_1e = bVar1 | 0x80;
  }
  else {
    local_1d = bVar4 | 0x80;
LAB_00123200:
    local_1d = local_1d | 0x80;
    local_1c = bVar3 | 0x80;
    bVar2 = false;
LAB_00123210:
    local_1c = local_1c | 0x80;
    local_1e = bVar1 | 0x80;
    if (0xfffffff < (uint)value) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,&local_1b);
    }
    if (!bVar2) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,&local_1d);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_1c);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (__return_storage_ptr__,&local_1e);
LAB_0012325e:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (__return_storage_ptr__,&local_1a);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uchar> MidiMessage::intToVlv(int value) {
	std::vector<uchar> output;
	if (value < 128) {
		output.push_back((uchar)value);
	} else {
		// calculate VLV bytes and insert into message
		uchar byte1 = value & 0x7f;
		uchar byte2 = (value >>  7) & 0x7f;
		uchar byte3 = (value >> 14) & 0x7f;
		uchar byte4 = (value >> 21) & 0x7f;
		uchar byte5 = (value >> 28) & 0x7f;
		if (byte5) {
			byte4 |= 0x80;
		}
		if (byte4) {
			byte4 |= 0x80;
			byte3 |= 0x80;
		}
		if (byte3) {
			byte3 |= 0x80;
			byte2 |= 0x80;
		}
		if (byte2) {
			byte2 |= 0x80;
		}
		if (byte5) { output.push_back(byte5); }
		if (byte4) { output.push_back(byte4); }
		if (byte3) { output.push_back(byte3); }
		if (byte2) { output.push_back(byte2); }
		output.push_back(byte1);
	}

	return output;
}